

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O0

void __thiscall argh::parser::add_params(parser *this,initializer_list<const_char_*const> init_list)

{
  char *pcVar1;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [40];
  char **name;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*const> *__range1;
  parser *this_local;
  initializer_list<const_char_*const> init_list_local;
  
  init_list_local._M_array = (iterator)init_list._M_len;
  this_local = (parser *)init_list._M_array;
  __begin1 = (const_iterator)&this_local;
  __range1 = (initializer_list<const_char_*const> *)this;
  __end1 = std::initializer_list<const_char_*const>::begin
                     ((initializer_list<const_char_*const> *)__begin1);
  name = std::initializer_list<const_char_*const>::end
                   ((initializer_list<const_char_*const> *)__begin1);
  for (; __end1 != name; __end1 = __end1 + 1) {
    local_60._32_8_ = __end1;
    pcVar1 = *__end1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar1,&local_81);
    trim_leading_dashes((parser *)local_60,(string *)this);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->registeredParams_,(value_type *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return;
}

Assistant:

inline void parser::add_params(std::initializer_list<char const* const> init_list)
   {
      for (auto& name : init_list)
         registeredParams_.insert(trim_leading_dashes(name));
   }